

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

void writeFile(MultiPartOutputFile *out,vector<partData,_std::allocator<partData>_> *parts,
              fileMetrics *metrics,bool logPerformance)

{
  byte bVar1;
  __type _Var2;
  OutputPart *pOVar3;
  string *psVar4;
  reference pvVar5;
  reference pvVar6;
  byte in_CL;
  vector<partStats,_std::allocator<partStats>_> *in_RDX;
  vector<partData,_std::allocator<partData>_> *in_RSI;
  MultiPartOutputFile *in_RDI;
  DeepTiledOutputPart outpart_3;
  DeepScanLineOutputPart outpart_2;
  TiledOutputPart outpart_1;
  OutputPart outpart;
  string type;
  size_t p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  DeepFrameBuffer *in_stack_ffffffffffffff78;
  OutputPart *out_00;
  DeepFrameBuffer *in_stack_ffffffffffffff88;
  DeepTiledOutputPart *in_stack_ffffffffffffff90;
  TiledOutputPart local_68 [24];
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *in_stack_ffffffffffffffb8;
  TiledOutputPart *in_stack_ffffffffffffffc0;
  OutputPart *local_28;
  
  bVar1 = in_CL & 1;
  local_28 = (OutputPart *)0x0;
  while (out_00 = local_28,
        pOVar3 = (OutputPart *)std::vector<partData,_std::allocator<partData>_>::size(in_RSI),
        out_00 < pOVar3) {
    Imf_3_4::MultiPartOutputFile::header((int)in_RDI);
    psVar4 = (string *)Imf_3_4::Header::type_abi_cxx11_();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,psVar4);
    _Var2 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (_Var2) {
      Imf_3_4::OutputPart::OutputPart((OutputPart *)&stack0xffffffffffffffb0,in_RDI,(int)local_28);
      pvVar6 = std::vector<partData,_std::allocator<partData>_>::operator[]
                         (in_RSI,(size_type)local_28);
      in_stack_ffffffffffffff78 = (DeepFrameBuffer *)&(pvVar6->readBuf).scanlineBuf;
      if (bVar1 == 0) {
        in_stack_ffffffffffffff70 = (vector<double,_std::allocator<double>_> *)0x0;
      }
      else {
        pvVar5 = std::vector<partStats,_std::allocator<partStats>_>::operator[]
                           (in_RDX,(size_type)local_28);
        in_stack_ffffffffffffff70 = &pvVar5->writePerf;
      }
      writeScanLine(out_00,(FrameBuffer *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    else {
      _Var2 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (_Var2) {
        Imf_3_4::TiledOutputPart::TiledOutputPart(local_68,in_RDI,(int)local_28);
        std::vector<partData,_std::allocator<partData>_>::operator[](in_RSI,(size_type)local_28);
        if (bVar1 == 0) {
          in_stack_ffffffffffffff60 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          pvVar5 = std::vector<partStats,_std::allocator<partStats>_>::operator[]
                             (in_RDX,(size_type)local_28);
          in_stack_ffffffffffffff60 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &pvVar5->writePerf;
        }
        writeTiled(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      }
      else {
        _Var2 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        if (_Var2) {
          Imf_3_4::DeepScanLineOutputPart::DeepScanLineOutputPart
                    ((DeepScanLineOutputPart *)&stack0xffffffffffffff90,in_RDI,(int)local_28);
          pvVar6 = std::vector<partData,_std::allocator<partData>_>::operator[]
                             (in_RSI,(size_type)local_28);
          in_stack_ffffffffffffff58 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &(pvVar6->readBuf).deepbuf;
          if (bVar1 != 0) {
            std::vector<partStats,_std::allocator<partStats>_>::operator[]
                      (in_RDX,(size_type)local_28);
          }
          writeDeepScanLine((DeepScanLineOutputPart *)out_00,in_stack_ffffffffffffff78,
                            in_stack_ffffffffffffff70);
        }
        else {
          _Var2 = std::operator==(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
          if (_Var2) {
            Imf_3_4::DeepTiledOutputPart::DeepTiledOutputPart
                      ((DeepTiledOutputPart *)&stack0xffffffffffffff88,in_RDI,(int)local_28);
            std::vector<partData,_std::allocator<partData>_>::operator[](in_RSI,(size_type)local_28)
            ;
            if (bVar1 != 0) {
              std::vector<partStats,_std::allocator<partStats>_>::operator[]
                        (in_RDX,(size_type)local_28);
            }
            writeDeepTiled(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                           (vector<double,_std::allocator<double>_> *)out_00);
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void
writeFile (
    MultiPartOutputFile& out,
    vector<partData>&    parts,
    fileMetrics&         metrics,
    bool                 logPerformance)
{
    //
    // Call initialization functions, Read image from source.
    //
    for (size_t p = 0; p < parts.size (); ++p)
    {
        string type = out.header (p).type ();

        if (type == SCANLINEIMAGE)
        {
            OutputPart outpart (out, p);
            writeScanLine (
                outpart,
                parts[p].readBuf.scanlineBuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
        else if (type == TILEDIMAGE)
        {
            TiledOutputPart outpart (out, p);
            writeTiled (
                outpart,
                parts[p].readBuf.tiledBuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
        else if (type == DEEPSCANLINE)
        {
            DeepScanLineOutputPart outpart (out, p);
            writeDeepScanLine (
                outpart,
                parts[p].readBuf.deepbuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
        else if (type == DEEPTILE)
        {
            DeepTiledOutputPart outpart (out, p);
            writeDeepTiled (
                outpart,
                parts[p].readBuf.deepbuf,
                logPerformance ? &metrics.stats[p].writePerf : nullptr);
        }
    }
}